

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void handle_vec_simd_sqshrn
               (DisasContext_conflict1 *s,_Bool is_scalar,_Bool is_q,_Bool is_u_shift,
               _Bool is_u_narrow,int immh,int immb,int opcode,int rn,int rd)

{
  TCGContext_conflict1 *tcg_ctx;
  NeonGenNarrowEnvFn *pNVar1;
  _Bool _Var2;
  int shift;
  NeonGenNarrowEnvFn **ppNVar3;
  TCGv_i64 tcg_dest;
  TCGv_i64 tcg_res;
  TCGv_i32 arg;
  TCGv_i64 tcg_src;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint element;
  int iVar7;
  TCGv_i64 local_78;
  
  uVar6 = 0x20;
  if (immh != 0) {
    uVar6 = 0x1f;
    if (immh != 0) {
      for (; (uint)immh >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  iVar7 = 0x1f - uVar6;
  bVar4 = 0x22 - (char)uVar6;
  uVar5 = 1;
  if (!is_scalar) {
    uVar5 = 0x40 >> (bVar4 & 0x1f);
  }
  if (0xf < (uint)immh) {
    __assert_fail("size < 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x20ff,
                  "void handle_vec_simd_sqshrn(DisasContext *, _Bool, _Bool, _Bool, _Bool, int, int, int, int, int)"
                 );
  }
  if (7 < (uint)immh) {
    unallocated_encoding_aarch64(s);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  _Var2 = fp_access_check(s);
  if (_Var2) {
    shift = (0x10 << ((byte)iVar7 & 0x1f)) - (immh << 3 | immb);
    ppNVar3 = handle_vec_simd_sqshrn::signed_narrow_fns[iVar7] + is_u_narrow;
    if (is_u_shift) {
      ppNVar3 = handle_vec_simd_sqshrn::unsigned_narrow_fns + iVar7;
    }
    tcg_dest = tcg_temp_new_i64(tcg_ctx);
    tcg_res = tcg_temp_new_i64(tcg_ctx);
    arg = tcg_temp_new_i32(tcg_ctx);
    element = 0;
    tcg_src = tcg_const_i64_aarch64(tcg_ctx,0);
    pNVar1 = *ppNVar3;
    local_78 = (TCGv_i64)0x0;
    if ((opcode & 1U) != 0) {
      local_78 = tcg_const_i64_aarch64(tcg_ctx,1L << ((char)shift - 1U & 0x3f));
    }
    for (; uVar5 != element; element = element + 1) {
      read_vec_element(s,tcg_dest,rn,element,(uint)!is_u_shift << 2 | MO_ALIGN_4 - uVar6);
      handle_shri_with_rndacc
                (tcg_ctx,tcg_res,tcg_dest,local_78,false,is_u_shift,MO_ALIGN_4 - uVar6,shift);
      (*pNVar1)(tcg_ctx,arg,tcg_ctx->cpu_env,tcg_res);
      tcg_gen_extu_i32_i64_aarch64(tcg_ctx,tcg_res,arg);
      tcg_gen_deposit_i64_aarch64
                (tcg_ctx,tcg_src,tcg_src,tcg_res,element << (bVar4 & 0x1f),8 << ((byte)iVar7 & 0x1f)
                );
    }
    write_vec_element(s,tcg_src,rd,(uint)is_q,MO_64);
    if ((opcode & 1U) != 0) {
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_78 + (long)tcg_ctx));
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_res + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_src + (long)tcg_ctx));
    clear_vec_high(s,is_q,rd);
    return;
  }
  return;
}

Assistant:

static void handle_vec_simd_sqshrn(DisasContext *s, bool is_scalar, bool is_q,
                                   bool is_u_shift, bool is_u_narrow,
                                   int immh, int immb, int opcode,
                                   int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int immhb = immh << 3 | immb;
    int size = 32 - clz32(immh) - 1;
    int esize = 8 << size;
    int shift = (2 * esize) - immhb;
    int elements = is_scalar ? 1 : (64 / esize);
    bool round = extract32(opcode, 0, 1);
    MemOp ldop = (size + 1) | (is_u_shift ? 0 : MO_SIGN);
    TCGv_i64 tcg_rn, tcg_rd, tcg_round;
    TCGv_i32 tcg_rd_narrowed;
    TCGv_i64 tcg_final;

    static NeonGenNarrowEnvFn * const signed_narrow_fns[4][2] = {
        { gen_helper_neon_narrow_sat_s8,
          gen_helper_neon_unarrow_sat8 },
        { gen_helper_neon_narrow_sat_s16,
          gen_helper_neon_unarrow_sat16 },
        { gen_helper_neon_narrow_sat_s32,
          gen_helper_neon_unarrow_sat32 },
        { NULL, NULL },
    };
    static NeonGenNarrowEnvFn * const unsigned_narrow_fns[4] = {
        gen_helper_neon_narrow_sat_u8,
        gen_helper_neon_narrow_sat_u16,
        gen_helper_neon_narrow_sat_u32,
        NULL
    };
    NeonGenNarrowEnvFn *narrowfn;

    int i;

    assert(size < 4);

    if (extract32(immh, 3, 1)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (is_u_shift) {
        narrowfn = unsigned_narrow_fns[size];
    } else {
        narrowfn = signed_narrow_fns[size][is_u_narrow ? 1 : 0];
    }

    tcg_rn = tcg_temp_new_i64(tcg_ctx);
    tcg_rd = tcg_temp_new_i64(tcg_ctx);
    tcg_rd_narrowed = tcg_temp_new_i32(tcg_ctx);
    tcg_final = tcg_const_i64(tcg_ctx, 0);

    if (round) {
        uint64_t round_const = 1ULL << (shift - 1);
        tcg_round = tcg_const_i64(tcg_ctx, round_const);
    } else {
        tcg_round = NULL;
    }

    for (i = 0; i < elements; i++) {
        read_vec_element(s, tcg_rn, rn, i, ldop);
        handle_shri_with_rndacc(tcg_ctx, tcg_rd, tcg_rn, tcg_round,
                                false, is_u_shift, size+1, shift);
        narrowfn(tcg_ctx, tcg_rd_narrowed, tcg_ctx->cpu_env, tcg_rd);
        tcg_gen_extu_i32_i64(tcg_ctx, tcg_rd, tcg_rd_narrowed);
        tcg_gen_deposit_i64(tcg_ctx, tcg_final, tcg_final, tcg_rd, esize * i, esize);
    }

    if (!is_q) {
        write_vec_element(s, tcg_final, rd, 0, MO_64);
    } else {
        write_vec_element(s, tcg_final, rd, 1, MO_64);
    }

    if (round) {
        tcg_temp_free_i64(tcg_ctx, tcg_round);
    }
    tcg_temp_free_i64(tcg_ctx, tcg_rn);
    tcg_temp_free_i64(tcg_ctx, tcg_rd);
    tcg_temp_free_i32(tcg_ctx, tcg_rd_narrowed);
    tcg_temp_free_i64(tcg_ctx, tcg_final);

    clear_vec_high(s, is_q, rd);
}